

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_testing::NiceMock<MockNLHandler>_>::
Read(NLReader<mp::internal::TextReader<fmt::Locale>,_testing::NiceMock<MockNLHandler>_> *this)

{
  NiceMock<MockNLHandler> *in_RDI;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
  reader;
  TextReader<fmt::Locale> bound_reader;
  VarBoundHandler<testing::NiceMock<MockNLHandler>_> bound_handler;
  MockNLHandler *in_stack_ffffffffffffff60;
  NLHeader *in_stack_ffffffffffffff68;
  TextReader<fmt::Locale> *in_stack_ffffffffffffff70;
  TextReader<fmt::Locale> local_70;
  VarBoundHandler<testing::NiceMock<MockNLHandler>_> local_18;
  
  if (((ulong)(in_RDI->super_MockNLHandler).gmock1_OnUnhandled_63.
              super_FunctionMockerBase<void_(const_char_*)>.super_UntypedFunctionMockerBase.name_ &
      1) == 0) {
    Read((NLReader<mp::internal::TextReader<fmt::Locale>,_testing::NiceMock<MockNLHandler>_> *)
         bound_reader.super_ReaderBase.name_.field_2._8_8_,
         (TextReader<fmt::Locale> *)
         bound_reader.super_ReaderBase.name_.field_2._M_allocated_capacity);
  }
  else {
    VarBoundHandler<testing::NiceMock<MockNLHandler>_>::VarBoundHandler
              ((VarBoundHandler<testing::NiceMock<MockNLHandler>_> *)in_stack_ffffffffffffff60,
               in_RDI);
    TextReader<fmt::Locale>::TextReader
              (in_stack_ffffffffffffff70,(TextReader<fmt::Locale> *)in_stack_ffffffffffffff68);
    NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
    ::NLReader((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                *)&stack0xffffffffffffff60,&local_70,
               (NLHeader *)
               (in_RDI->super_MockNLHandler).gmock1_OnUnhandled_63.
               super_FunctionMockerBase<void_(const_char_*)>.super_UntypedFunctionMockerBase.
               _vptr_UntypedFunctionMockerBase,&local_18,
               *(int *)&(in_RDI->super_MockNLHandler).gmock1_OnUnhandled_63.
                        super_FunctionMockerBase<void_(const_char_*)>.
                        super_UntypedFunctionMockerBase.name_);
    NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
    ::Read((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
            *)bound_reader.super_ReaderBase.name_.field_2._8_8_,
           (TextReader<fmt::Locale> *)
           bound_reader.super_ReaderBase.name_.field_2._M_allocated_capacity);
    Read((NLReader<mp::internal::TextReader<fmt::Locale>,_testing::NiceMock<MockNLHandler>_> *)
         bound_reader.super_ReaderBase.name_.field_2._8_8_,
         (TextReader<fmt::Locale> *)
         bound_reader.super_ReaderBase.name_.field_2._M_allocated_capacity);
    TextReader<fmt::Locale>::~TextReader((TextReader<fmt::Locale> *)in_stack_ffffffffffffff60);
    VarBoundHandler<testing::NiceMock<MockNLHandler>_>::~VarBoundHandler
              ((VarBoundHandler<testing::NiceMock<MockNLHandler>_> *)0x23059e);
  }
  MockNLHandler::EndInput(in_stack_ffffffffffffff60);
  return;
}

Assistant:

void NLReader<Reader, Handler>::Read() {
  if ((flags_ & READ_BOUNDS_FIRST) != 0) {
    // Read variable bounds first because this allows more efficient
    // problem construction.
    VarBoundHandler<Handler> bound_handler(handler_);
    Reader bound_reader(reader_);
    NLReader< Reader, VarBoundHandler<Handler> >
        reader(bound_reader, header_, bound_handler, flags_);
    reader.Read(0);
    // Read everything else.
    Read(&bound_reader);
  } else {
    Read(0);
  }
  handler_.EndInput();
}